

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::
GenerateInlineAccessorDefinitions(SingularStringView *this,Printer *p)

{
  long lVar1;
  allocator<char> local_3c4;
  allocator<char> local_3c3;
  allocator<char> local_3c2;
  allocator<char> local_3c1;
  Printer *p_local;
  _Any_data local_3b8;
  code *local_3a8;
  code *pcStack_3a0;
  undefined1 *local_390;
  undefined8 local_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined1 *local_370;
  undefined8 local_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined1 *local_350;
  undefined8 local_348;
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined1 *local_330;
  undefined8 local_328;
  undefined1 local_320 [8];
  undefined8 uStack_318;
  undefined1 local_310 [64];
  char local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  variant<std::__cxx11::string,std::function<bool()>> local_238 [32];
  char local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"if_IsDefault",&local_3c1)
  ;
  local_310._0_8_ = local_310 + 0x10;
  if (local_330 == local_320) {
    local_310._24_8_ = uStack_318;
  }
  else {
    local_310._0_8_ = local_330;
  }
  local_310._8_8_ = local_328;
  local_328 = 0;
  local_320[0] = 0;
  local_3a8 = (code *)0x0;
  pcStack_3a0 = (code *)0x0;
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  local_330 = local_320;
  local_3b8._M_unused._M_object = operator_new(0x18);
  *(SingularStringView **)local_3b8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_3b8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_3b8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_3a0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_3a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_310 + 0x20),
             (function<bool_()> *)&local_3b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  if (local_2d0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_2c8);
  }
  local_260 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"update_hasbit",&local_3c2);
  local_258 = local_248;
  if (local_350 == local_340) {
    uStack_240 = uStack_338;
  }
  else {
    local_258 = local_350;
  }
  local_250 = local_348;
  local_348 = 0;
  local_340[0] = 0;
  local_3a8 = (code *)0x0;
  pcStack_3a0 = (code *)0x0;
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  local_350 = local_340;
  local_3b8._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_3b8._M_unused._0_8_ = &p_local;
  *(SingularStringView **)((long)local_3b8._M_unused._0_8_ + 8) = this;
  *(code *)((long)local_3b8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_3a0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_3a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_238,(function<bool_()> *)&local_3b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  if (local_218 == '\x01') {
    std::__cxx11::string::assign((char *)&local_210);
  }
  local_1a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"set_args",&local_3c3);
  local_1a0 = local_190;
  if (local_370 == local_360) {
    uStack_188 = uStack_358;
  }
  else {
    local_1a0 = local_370;
  }
  local_198 = local_368;
  local_368 = 0;
  local_360[0] = 0;
  local_3a8 = (code *)0x0;
  pcStack_3a0 = (code *)0x0;
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  local_370 = local_360;
  local_3b8._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_3b8._M_unused._0_8_ = &p_local;
  *(SingularStringView **)((long)local_3b8._M_unused._0_8_ + 8) = this;
  *(code *)((long)local_3b8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_3a0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_3a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_180,(function<bool_()> *)&local_3b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  if (local_160 == '\x01') {
    std::__cxx11::string::assign((char *)&local_158);
  }
  local_f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"check_hasbit",&local_3c4)
  ;
  local_e8 = local_d8;
  if (local_390 == local_380) {
    uStack_d0 = uStack_378;
  }
  else {
    local_e8 = local_390;
  }
  local_e0 = local_388;
  local_388 = 0;
  local_380[0] = 0;
  local_3a8 = (code *)0x0;
  pcStack_3a0 = (code *)0x0;
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  local_390 = local_380;
  local_3b8._M_unused._M_object = operator_new(0x18);
  *(SingularStringView **)local_3b8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_3b8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_3b8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_3a0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_3a8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_3b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  io::Printer::Emit(p,local_310,4,0x45e,
                    "\n        inline ::absl::string_view $Msg$::$name$() const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          $if_IsDefault$;\n          return _internal_$name_internal$();\n        }\n        template <typename Arg_>\n        PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $PrepareSplitMessageForWrite$;\n          $update_hasbit$;\n          $field_$.Set(static_cast<Arg_&&>(arg), $set_args$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        inline ::absl::string_view $Msg$::_internal_$name_internal$() const {\n          $TsanDetectConcurrentRead$;\n          $check_hasbit$;\n          return $field_$.Get();\n        }\n        inline void $Msg$::_internal_set_$name_internal$(::absl::string_view value) {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          $field_$.Set(value, $set_args$);\n        }\n      "
                   );
  lVar1 = 0x228;
  do {
    io::Printer::Sub::~Sub((Sub *)(local_310 + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    io::Printer::Emit(p_local,0x7b,
                      "\n      inline bool $Msg$::_internal_$name_internal$_donated() const {\n        return $inlined_string_donated$;\n      }\n    "
                     );
  }
  return;
}

Assistant:

void SingularStringView::GenerateInlineAccessorDefinitions(
    io::Printer* p) const {
  p->Emit(
      {
          {"if_IsDefault",
           [&] {
             if (EmptyDefault() || is_oneof() || use_micro_string()) return;
             p->Emit(R"cc(
               if ($field_$.IsDefault()) {
                 return $default_variable_field$.get();
               }
             )cc");
           }},
          {"update_hasbit", [&] { UpdateHasbitSet(p, is_oneof()); }},
          {"set_args", [&] { ArgsForSetter(p, is_inlined()); }},
          {"check_hasbit",
           [&] {
             if (!is_oneof()) return;
             p->Emit(R"cc(
               if ($not_has_field$) {
                 return $kDefaultStr$;
               }
             )cc");
           }},
      },
      R"cc(
        inline ::absl::string_view $Msg$::$name$() const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          $if_IsDefault$;
          return _internal_$name_internal$();
        }
        template <typename Arg_>
        PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $update_hasbit$;
          $field_$.Set(static_cast<Arg_&&>(arg), $set_args$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        inline ::absl::string_view $Msg$::_internal_$name_internal$() const {
          $TsanDetectConcurrentRead$;
          $check_hasbit$;
          return $field_$.Get();
        }
        inline void $Msg$::_internal_set_$name_internal$(::absl::string_view value) {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          $field_$.Set(value, $set_args$);
        }
      )cc");

  if (is_inlined()) {
    p->Emit(R"cc(
      inline bool $Msg$::_internal_$name_internal$_donated() const {
        return $inlined_string_donated$;
      }
    )cc");
  }
}